

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  CommentInfo *pCVar2;
  string local_40;
  
  pCVar2 = root->comments_;
  if (pCVar2 != (CommentInfo *)0x0) {
    if (pCVar2[1].comment_ != (char *)0x0) {
      poVar1 = std::operator<<(this->document_,' ');
      Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pCVar2 = root->comments_;
      if (pCVar2 == (CommentInfo *)0x0) goto LAB_00114170;
    }
    if (pCVar2[2].comment_ != (char *)0x0) {
      writeIndent(this);
      poVar1 = this->document_;
      Value::getComment_abi_cxx11_(&local_40,root,commentAfter);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
LAB_00114170:
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}